

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::ConstructMessage<duckdb::LogicalType,duckdb::LogicalType,unsigned_long>
          (string *__return_storage_ptr__,Exception *this,string *msg,LogicalType *params,
          LogicalType *params_1,unsigned_long params_2)

{
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  _Alloc_hider params_1_00;
  LogicalType local_50;
  LogicalType local_38;
  
  params_1_00._M_p = (pointer)0x0;
  LogicalType::LogicalType(&local_38,(LogicalType *)msg);
  LogicalType::LogicalType(&local_50,params);
  ConstructMessageRecursive<duckdb::LogicalType,duckdb::LogicalType,unsigned_long>
            (__return_storage_ptr__,this,(string *)&stack0xffffffffffffff98,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             &local_38,&local_50,params_1,(unsigned_long)params_1_00._M_p);
  LogicalType::~LogicalType(&local_50);
  LogicalType::~LogicalType(&local_38);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
          &stack0xffffffffffffff98);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}